

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SystemTools.cxx
# Opt level: O0

string * cmsys::SystemTools::CollapseFullPath
                   (string *__return_storage_ptr__,string *in_path,char *in_base)

{
  allocator<char> local_41;
  undefined1 local_40 [8];
  string tmp_base;
  char *in_base_local;
  string *in_path_local;
  
  tmp_base.field_2._8_8_ = in_base;
  if (in_base == (char *)0x0) {
    anon_unknown_11::CollapseFullPathImpl(__return_storage_ptr__,in_path,(string *)0x0);
  }
  else {
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>((string *)local_40,in_base,&local_41);
    std::allocator<char>::~allocator(&local_41);
    anon_unknown_11::CollapseFullPathImpl(__return_storage_ptr__,in_path,(string *)local_40);
    std::__cxx11::string::~string((string *)local_40);
  }
  return __return_storage_ptr__;
}

Assistant:

std::string SystemTools::CollapseFullPath(std::string const& in_path,
                                          const char* in_base)
{
  if (!in_base) {
    return CollapseFullPathImpl(in_path, nullptr);
  }
  std::string tmp_base = in_base;
  return CollapseFullPathImpl(in_path, &tmp_base);
}